

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

deUint32 __thiscall sglr::GLContext::createProgram(GLContext *this,ShaderProgram *shader)

{
  pointer *pppSVar1;
  bool bVar2;
  RenderContext *renderCtx;
  pointer pcVar3;
  iterator __position;
  ShaderProgram *pSVar4;
  TestError *this_00;
  long lVar5;
  ShaderProgram *program;
  ProgramSources sources;
  ShaderProgram *local_188;
  vector<glu::ShaderProgram*,std::allocator<glu::ShaderProgram*>> *local_180;
  uint local_178;
  value_type local_170;
  uint local_150;
  value_type local_148;
  uint local_128;
  value_type local_120;
  ProgramSources local_100;
  
  local_180 = (vector<glu::ShaderProgram*,std::allocator<glu::ShaderProgram*>> *)&this->m_programs;
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::reserve
            ((vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_> *)local_180,
             ((long)(this->m_programs).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_programs).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  local_188 = (ShaderProgram *)0x0;
  bVar2 = shader->m_hasGeometryShader;
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_context;
  if (bVar2 == false) {
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources,&shader->m_vertSrc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + 1,&shader->m_fragSrc);
    glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,&local_100);
    local_188 = pSVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
  }
  else {
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    local_150 = 0;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    pcVar3 = (shader->m_vertSrc)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar3,pcVar3 + (shader->m_vertSrc)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + local_150,&local_148);
    local_178 = 1;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    pcVar3 = (shader->m_fragSrc)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + (shader->m_fragSrc)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + local_178,&local_170);
    local_128 = 2;
    pcVar3 = (shader->m_geomSrc)._M_dataplus._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar3,pcVar3 + (shader->m_geomSrc)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + local_128,&local_120);
    glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,&local_100);
    local_188 = pSVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
  }
  if ((local_188->m_program).m_info.linkOk == false) {
    glu::operator<<(this->m_log,local_188);
    pSVar4 = local_188;
    if (local_188 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(local_188);
      operator_delete(pSVar4,0xd0);
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrGLContext.cpp"
               ,0x364);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((this->m_logFlags & 2) != 0) {
    glu::operator<<(this->m_log,local_188);
  }
  __position._M_current =
       (this->m_programs).
       super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_programs).
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderProgram*,std::allocator<glu::ShaderProgram*>>::
    _M_realloc_insert<glu::ShaderProgram*const&>(local_180,__position,&local_188);
  }
  else {
    *__position._M_current = local_188;
    pppSVar1 = &(this->m_programs).
                super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return (local_188->m_program).m_program;
}

Assistant:

deUint32 GLContext::createProgram (ShaderProgram* shader)
{
	m_programs.reserve(m_programs.size()+1);

	glu::ShaderProgram* program = DE_NULL;

	if (!shader->m_hasGeometryShader)
		program = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(shader->m_vertSrc, shader->m_fragSrc));
	else
		program = new glu::ShaderProgram(m_context,
										 glu::ProgramSources() << glu::VertexSource(shader->m_vertSrc)
															   << glu::FragmentSource(shader->m_fragSrc)
															   << glu::GeometrySource(shader->m_geomSrc));

	if (!program->isOk())
	{
		m_log << *program;
		delete program;
		TCU_FAIL("Compile failed");
	}

	if ((m_logFlags & GLCONTEXT_LOG_PROGRAMS) != 0)
		m_log << *program;

	m_programs.push_back(program);
	return program->getProgram();
}